

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

void __thiscall DROPlayer::RefreshTSRates(DROPlayer *this)

{
  uint uVar1;
  ulong uVar2;
  UINT64 UVar3;
  
  this->_ttMult = 1;
  uVar1 = (this->_playOpts).genOpts.pbSpeed;
  this->_tsDiv = (ulong)this->_tickFreq;
  if ((uVar1 & 0xfffeffff) != 0) {
    this->_ttMult = 0x10000;
    this->_tsDiv = (ulong)uVar1 * (ulong)this->_tickFreq;
  }
  UVar3 = (ulong)(this->super_PlayerBase)._outSmplRate * this->_ttMult;
  this->_tsMult = UVar3;
  uVar2 = this->_lastTsMult;
  if ((UVar3 - uVar2 != 0) || (this->_tsDiv != this->_lastTsDiv)) {
    if ((uVar2 != 0) && (this->_lastTsDiv != 0)) {
      this->_playSmpl =
           (UINT32)((((this->_lastTsDiv * (ulong)this->_playSmpl) / uVar2) * UVar3) / this->_tsDiv);
    }
    this->_lastTsMult = UVar3;
    this->_lastTsDiv = this->_tsDiv;
  }
  return;
}

Assistant:

void DROPlayer::RefreshTSRates(void)
{
	_ttMult = 1;
	_tsDiv = _tickFreq;
	if (_playOpts.genOpts.pbSpeed != 0 && _playOpts.genOpts.pbSpeed != 0x10000)
	{
		_ttMult *= 0x10000;
		_tsDiv *= _playOpts.genOpts.pbSpeed;
	}
	_tsMult = _ttMult * _outSmplRate;
	if (_tsMult != _lastTsMult ||
	    _tsDiv != _lastTsDiv)
	{
		if (_lastTsMult && _lastTsDiv)	// the order * / * / is required to avoid overflow
			_playSmpl = (UINT32)(_playSmpl * _lastTsDiv / _lastTsMult * _tsMult / _tsDiv);
		_lastTsMult = _tsMult;
		_lastTsDiv = _tsDiv;
	}
	return;
}